

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_delta_lflevel(AV1_COMMON *cm,MACROBLOCKD *xd,int lf_id,int delta_lflevel,
                        int delta_lf_multi,aom_writer *w)

{
  qm_val_t **icdf;
  ushort uVar1;
  uint uVar2;
  short sVar3;
  ushort uVar4;
  byte bVar5;
  int iVar6;
  undefined4 in_register_00000084;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  qm_val_t **ppqVar12;
  uint16_t *icdf_00;
  
  lVar7 = CONCAT44(in_register_00000084,delta_lf_multi);
  uVar11 = (ulong)(uint)-lf_id;
  if (0 < lf_id) {
    uVar11 = (ulong)(uint)lf_id;
  }
  uVar10 = (uint)uVar11;
  uVar9 = 3;
  if (uVar10 < 3) {
    uVar9 = uVar11;
  }
  if (delta_lflevel == 0) {
    icdf = (cm->quant_params).gqmatrix[0xf][1] + 0x10;
    od_ec_encode_cdf_q15((od_ec_enc *)(lVar7 + 0x10),(int)uVar9,(uint16_t *)icdf,4);
    if (*(char *)(lVar7 + 0x30) == '\0') goto LAB_0019827b;
    uVar4 = *(ushort *)((cm->quant_params).gqmatrix[0xf][1] + 0x11);
    ppqVar12 = (cm->quant_params).gqmatrix[0xf][1] + 0x11;
    bVar5 = (char)(uVar4 >> 4) + 5;
    uVar11 = 0;
    do {
      uVar1 = *(uint16_t *)((long)icdf + uVar11 * 2);
      if (uVar11 < uVar9) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar1) >> (bVar5 & 0x1f));
      }
      else {
        sVar3 = -(uVar1 >> (bVar5 & 0x1f));
      }
      *(ushort *)((long)icdf + uVar11 * 2) = sVar3 + uVar1;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  else {
    iVar6 = (int)xd;
    icdf_00 = (uint16_t *)((long)(cm->quant_params).gqmatrix[0xf][1] + (long)iVar6 * 10 + 0x58);
    od_ec_encode_cdf_q15((od_ec_enc *)(lVar7 + 0x10),(int)uVar9,icdf_00,4);
    if (*(char *)(lVar7 + 0x30) == '\0') goto LAB_0019827b;
    ppqVar12 = (qm_val_t **)((long)(cm->quant_params).gqmatrix[0xf][1] + (long)iVar6 * 10 + 0x60);
    uVar4 = *(ushort *)((long)(cm->quant_params).gqmatrix[0xf][1] + (long)iVar6 * 10 + 0x60);
    bVar5 = (char)(uVar4 >> 4) + 5;
    uVar11 = 0;
    do {
      uVar1 = icdf_00[uVar11];
      if (uVar11 < uVar9) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar1) >> (bVar5 & 0x1f));
      }
      else {
        sVar3 = -(uVar1 >> (bVar5 & 0x1f));
      }
      icdf_00[uVar11] = sVar3 + uVar1;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  *(ushort *)ppqVar12 = *(short *)ppqVar12 + (ushort)(uVar4 < 0x20);
LAB_0019827b:
  if (2 < uVar10) {
    uVar2 = 0x1f;
    if (uVar10 - 1 != 0) {
      for (; uVar10 - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar8 = 4;
    do {
      od_ec_encode_bool_q15
                ((od_ec_enc *)(lVar7 + 0x10),
                 (uint)((0x1e - (uVar2 ^ 0x1f) >> (uVar8 - 2 & 0x1f) & 1) != 0),0x4000);
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
    if ((uVar2 ^ 0x1f) != 0x1f) {
      uVar8 = uVar2 + 1;
      do {
        od_ec_encode_bool_q15
                  ((od_ec_enc *)(lVar7 + 0x10),
                   (uint)((uVar10 + ~(1 << ((byte)uVar2 & 0x1f)) >> (uVar8 - 2 & 0x1f) & 1) != 0),
                   0x4000);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
  }
  if (lf_id == 0) {
    return;
  }
  od_ec_encode_bool_q15((od_ec_enc *)(lVar7 + 0x10),(uint)lf_id >> 0x1f,0x4000);
  return;
}

Assistant:

static inline void write_delta_lflevel(const AV1_COMMON *cm,
                                       const MACROBLOCKD *xd, int lf_id,
                                       int delta_lflevel, int delta_lf_multi,
                                       aom_writer *w) {
  int sign = delta_lflevel < 0;
  int abs = sign ? -delta_lflevel : delta_lflevel;
  int rem_bits, thr;
  int smallval = abs < DELTA_LF_SMALL ? 1 : 0;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  (void)cm;

  if (delta_lf_multi) {
    assert(lf_id >= 0 && lf_id < (av1_num_planes(cm) > 1 ? FRAME_LF_COUNT
                                                         : FRAME_LF_COUNT - 2));
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL),
                     ec_ctx->delta_lf_multi_cdf[lf_id], DELTA_LF_PROBS + 1);
  } else {
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL), ec_ctx->delta_lf_cdf,
                     DELTA_LF_PROBS + 1);
  }

  if (!smallval) {
    rem_bits = get_msb(abs - 1);
    thr = (1 << rem_bits) + 1;
    aom_write_literal(w, rem_bits - 1, 3);
    aom_write_literal(w, abs - thr, rem_bits);
  }
  if (abs > 0) {
    aom_write_bit(w, sign);
  }
}